

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.cc
# Opt level: O0

void Imageio::declareImageioFormat
               (string *formatname,Creator inputCreator,char **inputExtensions,Creator outputCreator
               ,char **outputExtensions)

{
  long *plVar1;
  mapped_type *pp_Var2;
  mapped_type *pp_Var3;
  string *in_RCX;
  long *in_RDX;
  key_type *in_RSI;
  long *in_R8;
  bool bVar4;
  string ext_1;
  char **e_1;
  string ext;
  char **e;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
  *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  key_type *in_stack_fffffffffffffeb8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
  *in_stack_fffffffffffffec0;
  _Self local_118;
  _Self local_110;
  _Self local_108;
  _Self local_100;
  string local_f8;
  allocator<char> local_d1;
  undefined1 local_d0 [32];
  long *local_b0;
  _Self local_a8;
  _Self local_a0;
  _Self local_98;
  _Self local_90;
  string local_88;
  allocator<char> local_51;
  undefined1 local_50 [32];
  long *local_30;
  long *local_28;
  string *local_20;
  key_type *local_10;
  
  plVar1 = in_RDX;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  if (in_RSI != (key_type *)0x0) {
    while( true ) {
      local_30 = plVar1;
      bVar4 = false;
      if (local_30 != (long *)0x0) {
        bVar4 = *local_30 != 0;
      }
      if (!bVar4) break;
      ::std::allocator<char>::allocator();
      string::basic_string<std::allocator<char>>
                (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                 (allocator<char> *)0x165b68);
      ::std::allocator<char>::~allocator(&local_51);
      string::tolower(&local_88,(int)local_50);
      string::~string((string *)0x165b9b);
      local_90._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                   *)in_stack_fffffffffffffe78,(key_type *)0x165baf);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                  *)in_stack_fffffffffffffe78);
      bVar4 = std::operator==(&local_90,&local_98);
      if (bVar4) {
        in_stack_fffffffffffffeb8 = local_10;
        in_stack_fffffffffffffec0 =
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                ::operator[](in_stack_fffffffffffffec0,local_10);
        *(key_type **)&(in_stack_fffffffffffffec0->_M_t)._M_impl = in_stack_fffffffffffffeb8;
      }
      string::~string((string *)0x165c85);
      plVar1 = local_30 + 1;
    }
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                 *)in_stack_fffffffffffffe78,(key_type *)0x165cb2);
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                *)in_stack_fffffffffffffe78);
    bVar4 = std::operator==(&local_a0,&local_a8);
    if (bVar4) {
      pp_Var2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      *pp_Var2 = (mapped_type)local_10;
    }
  }
  if (local_20 != (string *)0x0) {
    local_b0 = local_28;
    while( true ) {
      bVar4 = false;
      if (local_b0 != (long *)0x0) {
        bVar4 = *local_b0 != 0;
      }
      if (!bVar4) break;
      ::std::allocator<char>::allocator();
      string::basic_string<std::allocator<char>>
                (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                 (allocator<char> *)0x165d9d);
      ::std::allocator<char>::~allocator(&local_d1);
      string::tolower(&local_f8,(int)local_d0);
      string::~string((string *)0x165dd0);
      local_100._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
           ::find(in_stack_fffffffffffffe78,(key_type *)0x165de4);
      local_108._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
           ::end(in_stack_fffffffffffffe78);
      bVar4 = std::operator==(&local_100,&local_108);
      if (bVar4) {
        in_stack_fffffffffffffe80 = local_20;
        pp_Var3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                                *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        *pp_Var3 = (mapped_type)in_stack_fffffffffffffe80;
      }
      string::~string((string *)0x165eba);
      local_b0 = local_b0 + 1;
    }
    local_110._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
         ::find(in_stack_fffffffffffffe78,(key_type *)0x165ee7);
    local_118._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
         ::end(in_stack_fffffffffffffe78);
    bVar4 = std::operator==(&local_110,&local_118);
    if (bVar4) {
      pp_Var3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                              *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      *pp_Var3 = (mapped_type)local_20;
    }
  }
  return;
}

Assistant:

void
declareImageioFormat(const std::string& formatname,
                     ImageInput::Creator inputCreator,
                     const char** inputExtensions,
                     ImageOutput::Creator outputCreator,
                     const char** outputExtensions)
{
    if (inputCreator) {
        for (const char** e = inputExtensions; e && *e; ++e) {
            string ext(*e);
            ext.tolower();
            if (inputFormats.find(ext) == inputFormats.end()) {
                inputFormats[ext] = inputCreator;
            }
        }
        if (inputFormats.find(formatname) == inputFormats.end())
            inputFormats[formatname] = inputCreator;
    }
    if (outputCreator) {
        for (const char** e = outputExtensions; e && *e; ++e) {
            string ext(*e);
            ext.tolower();
            if (outputFormats.find(ext) == outputFormats.end()) {
                outputFormats[ext] = outputCreator;
            }
        }
        if (outputFormats.find(formatname) == outputFormats.end())
            outputFormats[formatname] = outputCreator;
    }
}